

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::QueueUserAPC
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget,
          PAPCFUNC pfnAPC,ULONG_PTR uptrData)

{
  CRITICAL_SECTION *pCriticalSection;
  int iVar1;
  PAL_ERROR PVar2;
  int *piVar3;
  PAL_ERROR PVar4;
  PThreadApcInfoNode p_Var5;
  WaitDomain WVar6;
  _ThreadApcInfoNode *pobj;
  _ThreadApcInfoNode *local_58;
  _ThreadApcInfoNode *pObj;
  CPalSynchronizationManager *local_48;
  int *local_40;
  WaitDomain local_34;
  
  pObj = (_ThreadApcInfoNode *)&this->m_cacheThreadApcInfoNodes;
  local_58 = (_ThreadApcInfoNode *)0x0;
  local_48 = this;
  CSynchCache<CorUnix::_ThreadApcInfoNode>::Get
            ((CSynchCache<CorUnix::_ThreadApcInfoNode> *)pObj,pthrCurrent,1,&local_58);
  pobj = local_58;
  if (local_58 == (_ThreadApcInfoNode *)0x0) {
    PVar4 = 8;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00346089;
  }
  else {
    local_58->pfnAPC = pfnAPC;
    local_58->pAPCData = uptrData;
    local_58->pNext = (_ThreadApcInfoNode *)0x0;
    AcquireLocalSynchLock(pthrCurrent);
    local_34 = (pthrTarget->synchronizationInfo).m_twiWaitInfo.wdWaitDomain;
    if (local_34 != LocalWait) {
      AcquireSharedSynchLock(pthrCurrent);
    }
    pCriticalSection = &pthrTarget->m_csLock;
    InternalEnterCriticalSection(pthrCurrent,pCriticalSection);
    if (((pthrTarget->synchronizationInfo).m_tsThreadState == TS_DONE) ||
       (piVar3 = (int *)SHMPtrToPtr((pthrTarget->synchronizationInfo).m_shridWaitAwakened),
       *piVar3 == 3)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00346089;
      InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
      PVar4 = 0x57;
      WVar6 = local_34;
    }
    else {
      p_Var5 = (pthrTarget->apcInfo).m_ptainTail;
      if ((p_Var5 == (PThreadApcInfoNode)0x0) &&
         (p_Var5 = (PThreadApcInfoNode)&(pthrTarget->apcInfo).m_ptainHead,
         (pthrTarget->apcInfo).m_ptainHead != (PThreadApcInfoNode)0x0)) {
        local_40 = piVar3;
        fprintf(_stderr,"] %s %s:%d","QueueUserAPC",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x506);
        fprintf(_stderr,
                "Expression: NULL == pthrTarget->apcInfo.m_ptainHead, Description: Corrupted APC list\n"
               );
        piVar3 = local_40;
      }
      p_Var5->pNext = pobj;
      (pthrTarget->apcInfo).m_ptainTail = pobj;
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_00346089:
        abort();
      }
      PVar4 = 0;
      LOCK();
      iVar1 = *piVar3;
      if (iVar1 == 2) {
        *piVar3 = 0;
      }
      UNLOCK();
      InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
      WVar6 = local_34;
      if (iVar1 == 2) {
        UnRegisterWait(local_48,pthrCurrent,&(pthrTarget->synchronizationInfo).m_twiWaitInfo,
                       local_34 != LocalWait);
        PVar4 = 0;
        PVar2 = WakeUpLocalThread(pthrCurrent,pthrTarget,Alerted,0);
        if (PVar2 == 0) {
          pobj = (_ThreadApcInfoNode *)0x0;
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00346089;
          pobj = (_ThreadApcInfoNode *)0x0;
          PVar4 = PVar2;
        }
      }
      else {
        pobj = (_ThreadApcInfoNode *)0x0;
      }
    }
    if (WVar6 != LocalWait) {
      ReleaseSharedSynchLock(pthrCurrent);
    }
    ReleaseLocalSynchLock(pthrCurrent);
    if (pobj != (_ThreadApcInfoNode *)0x0) {
      CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
                ((CSynchCache<CorUnix::_ThreadApcInfoNode> *)pObj,pthrCurrent,pobj);
    }
  }
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::QueueUserAPC(CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        PAPCFUNC pfnAPC,
        ULONG_PTR uptrData)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadApcInfoNode * ptainNode = NULL;
        DWORD dwWaitState;
        DWORD * pdwWaitState;
        ThreadWaitInfo * pTargetTWInfo = GetThreadWaitInfo(pthrTarget);
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fThreadLock = false;

        ptainNode = m_cacheThreadApcInfoNodes.Get(pthrCurrent);
        if (NULL == ptainNode)
        {
            ERROR("No memory for new APCs linked list entry\n");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto QUAPC_exit;
        }

        ptainNode->pfnAPC = pfnAPC;
        ptainNode->pAPCData = uptrData;
        ptainNode->pNext = NULL;

        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        if (LocalWait != pTargetTWInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        pthrTarget->Lock(pthrCurrent);
        fThreadLock = true;

        if(TS_DONE == pthrTarget->synchronizationInfo.GetThreadState())
        {
            ERROR("Thread %#x has terminated; can't queue an APC on it\n",
                  pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }
        pdwWaitState = SharedIDToTypePointer(DWORD,
            pthrTarget->synchronizationInfo.m_shridWaitAwakened);
        if(TWS_EARLYDEATH == VolatileLoad(pdwWaitState))
        {
            ERROR("Thread %#x is about to be suspended for process shutdown, "
                  "can't queue an APC on it\n", pthrTarget->GetThreadId());
            palErr = ERROR_INVALID_PARAMETER;
            goto QUAPC_exit;
        }

        if (NULL == pthrTarget->apcInfo.m_ptainTail)
        {
            _ASSERT_MSG(NULL == pthrTarget->apcInfo.m_ptainHead,
                        "Corrupted APC list\n");

            pthrTarget->apcInfo.m_ptainHead = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }
        else
        {
            pthrTarget->apcInfo.m_ptainTail->pNext = ptainNode;
            pthrTarget->apcInfo.m_ptainTail = ptainNode;
        }

        // Set ptainNode to NULL so it won't be readded to the cache
        ptainNode = NULL;

        TRACE("APC %p with parameter %p added to APC queue\n",
             pfnAPC, uptrData);

        dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                 (LONG)TWS_ACTIVE,
                                                 (LONG)TWS_ALERTABLE);

        // Release thread lock
        pthrTarget->Unlock(pthrCurrent);
        fThreadLock = false;

        if(TWS_ALERTABLE == dwWaitState)
        {
            // Unregister the wait
            UnRegisterWait(pthrCurrent, pTargetTWInfo, fSharedSynchLock);

            // Wake up target thread
            palErr = WakeUpLocalThread(
                pthrCurrent,
                pthrTarget,
                Alerted,
                0);

            if (NO_ERROR != palErr)
            {
                ERROR("Failed to wakeup local thread %#x for dispatching "
                      "APCs [err=%u]\n", pthrTarget->GetThreadId(),
                      palErr);
            }
        }

    QUAPC_exit:
        if (fThreadLock)
        {
            pthrTarget->Unlock(pthrCurrent);
        }
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        if (ptainNode)
        {
            m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
        }
        return palErr;
    }